

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall ipx::Model::ScalePoint(Model *this,Vector *x,Vector *slack,Vector *y,Vector *z)

{
  int iVar1;
  bool bVar2;
  size_t sVar3;
  reference piVar4;
  double *pdVar5;
  valarray<double> *in_RSI;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_RDI;
  valarray<double> *in_R8;
  Int j;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc8;
  valarray<double> *in_stack_ffffffffffffffd0;
  
  sVar3 = std::valarray<double>::size((valarray<double> *)(in_RDI + 0x54));
  if (sVar3 != 0) {
    std::valarray<double>::operator/=
              (in_stack_ffffffffffffffd0,(valarray<double> *)in_stack_ffffffffffffffc8._M_current);
    std::valarray<double>::operator*=
              (in_stack_ffffffffffffffd0,(valarray<double> *)in_stack_ffffffffffffffc8._M_current);
  }
  sVar3 = std::valarray<double>::size((valarray<double> *)(in_RDI + 0x56));
  if (sVar3 != 0) {
    std::valarray<double>::operator/=
              (in_stack_ffffffffffffffd0,(valarray<double> *)in_stack_ffffffffffffffc8._M_current);
    std::valarray<double>::operator*=
              (in_stack_ffffffffffffffd0,(valarray<double> *)in_stack_ffffffffffffffc8._M_current);
  }
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar2) break;
    piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
             operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &stack0xffffffffffffffc8);
    iVar1 = *piVar4;
    pdVar5 = std::valarray<double>::operator[](in_RSI,(long)iVar1);
    *pdVar5 = *pdVar5 * -1.0;
    pdVar5 = std::valarray<double>::operator[](in_R8,(long)iVar1);
    *pdVar5 = *pdVar5 * -1.0;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

void Model::ScalePoint(Vector& x, Vector& slack, Vector& y, Vector& z) const {
    if (colscale_.size() > 0) {
        x /= colscale_;
        z *= colscale_;
    }
    if (rowscale_.size() > 0) {
        y /= rowscale_;
        slack *= rowscale_;
    }
    for (Int j : flipped_vars_) {
        x[j] *= -1.0;
        z[j] *= -1.0;
    }
}